

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O0

void __thiscall FCommandBuffer::Draw(FCommandBuffer *this,int x,int y,int scale,bool cursor)

{
  uint uVar1;
  uint uVar2;
  FFont *pFVar3;
  DFrameBuffer *pDVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  bool cursor_local;
  int scale_local;
  int y_local;
  int x_local;
  FCommandBuffer *this_local;
  
  pDVar4 = screen;
  pFVar3 = ConFont;
  if (scale == 1) {
    DCanvas::DrawChar((DCanvas *)screen,ConFont,8,x,y,'\x1c',0);
    pDVar4 = screen;
    pFVar3 = ConFont;
    iVar5 = (*ConFont->_vptr_FFont[3])(ConFont,0x1c);
    pcVar9 = FString::operator[](&this->Text,this->StartPos);
    DCanvas::DrawText((DCanvas *)pDVar4,pFVar3,8,x + iVar5,y,pcVar9,0);
    pDVar4 = screen;
    pFVar3 = ConFont;
    if (cursor) {
      iVar5 = (*ConFont->_vptr_FFont[3])(ConFont,0x1c);
      uVar1 = this->CursorPos;
      uVar2 = this->StartPos;
      iVar6 = (*ConFont->_vptr_FFont[3])(ConFont,0xb);
      DCanvas::DrawChar((DCanvas *)pDVar4,pFVar3,10,x + iVar5 + (uVar1 - uVar2) * iVar6,y,'\v',0);
    }
  }
  else {
    iVar5 = DCanvas::GetWidth((DCanvas *)screen);
    iVar6 = DCanvas::GetHeight((DCanvas *)screen);
    DCanvas::DrawChar((DCanvas *)pDVar4,pFVar3,8,x,y,'\x1c',0x40001399,iVar5 / scale,0x4000139a,
                      iVar6 / scale,0x400013a8,1,0);
    pDVar4 = screen;
    pFVar3 = ConFont;
    iVar5 = (*ConFont->_vptr_FFont[3])(ConFont,0x1c);
    pcVar9 = FString::operator[](&this->Text,this->StartPos);
    iVar6 = DCanvas::GetWidth((DCanvas *)screen);
    iVar7 = DCanvas::GetHeight((DCanvas *)screen);
    DCanvas::DrawText((DCanvas *)pDVar4,pFVar3,8,x + iVar5,y,pcVar9,0x40001399,iVar6 / scale,
                      0x4000139a,iVar7 / scale,0x400013a8,1,0);
    pDVar4 = screen;
    pFVar3 = ConFont;
    if (cursor) {
      iVar5 = (*ConFont->_vptr_FFont[3])(ConFont,0x1c);
      uVar1 = this->CursorPos;
      uVar2 = this->StartPos;
      iVar6 = (*ConFont->_vptr_FFont[3])(ConFont,0xb);
      iVar7 = DCanvas::GetWidth((DCanvas *)screen);
      iVar8 = DCanvas::GetHeight((DCanvas *)screen);
      DCanvas::DrawChar((DCanvas *)pDVar4,pFVar3,10,x + iVar5 + (uVar1 - uVar2) * iVar6,y,'\v',
                        0x40001399,iVar7 / scale,0x4000139a,iVar8 / scale,0x400013a8,1,0);
    }
  }
  return;
}

Assistant:

void Draw(int x, int y, int scale, bool cursor)
	{
		if (scale == 1)
		{
			screen->DrawChar(ConFont, CR_ORANGE, x, y, '\x1c', TAG_DONE);
			screen->DrawText(ConFont, CR_ORANGE, x + ConFont->GetCharWidth(0x1c), y,
				&Text[StartPos], TAG_DONE);

			if (cursor)
			{
				screen->DrawChar(ConFont, CR_YELLOW,
					x + ConFont->GetCharWidth(0x1c) + (CursorPos - StartPos) * ConFont->GetCharWidth(0xb),
					y, '\xb', TAG_DONE);
			}
		}
		else
		{
			screen->DrawChar(ConFont, CR_ORANGE, x, y, '\x1c',
				DTA_VirtualWidth, screen->GetWidth() / scale,
				DTA_VirtualHeight, screen->GetHeight() / scale,
				DTA_KeepRatio, true, TAG_DONE);

			screen->DrawText(ConFont, CR_ORANGE, x + ConFont->GetCharWidth(0x1c), y,
				&Text[StartPos],
				DTA_VirtualWidth, screen->GetWidth() / scale,
				DTA_VirtualHeight, screen->GetHeight() / scale,
				DTA_KeepRatio, true, TAG_DONE);

			if (cursor)
			{
				screen->DrawChar(ConFont, CR_YELLOW,
					x + ConFont->GetCharWidth(0x1c) + (CursorPos - StartPos) * ConFont->GetCharWidth(0xb),
					y, '\xb',
					DTA_VirtualWidth, screen->GetWidth() / scale,
					DTA_VirtualHeight, screen->GetHeight() / scale,
					DTA_KeepRatio, true, TAG_DONE);
			}
		}
	}